

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:489:63)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:489:63)>
       *this,model *to)

{
  to->_vptr_model = (_func_int **)&PTR_destroy_001da070;
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::__30
            ((__30 *)(to + 1),&(this->f).get_data_object);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(to + 5),&(this->f).global.super_gc_heap_ptr_untyped);
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }